

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O1

void __thiscall HACD::RaycastMesh::RaycastMesh(RaycastMesh *this)

{
  this->m_triangles = (Vec3<long> *)0x0;
  this->m_vertices = (Vec3<double> *)0x0;
  this->m_nVertices = 0;
  this->m_nTriangles = 0;
  this->m_nodes = (RMNode *)0x0;
  this->m_nNodes = SUB168(ZEXT416(0) << 0x40,0);
  this->m_nMaxNodes = SUB168(ZEXT416(0) << 0x40,8);
  return;
}

Assistant:

RaycastMesh::RaycastMesh(void)
	{
		m_triangles  = 0;			
		m_vertices   = 0;		
		m_nVertices  = 0;
		m_nTriangles = 0;
		m_nodes		 = 0;
		m_nNodes	 = 0;
		m_nMaxNodes  = 0;
	}